

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O3

void do_proficiencies(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  long lVar2;
  CProficiencies *pCVar3;
  CHAR_DATA *trainer;
  
  if ((ch->act[0] & 1) == 0) {
    trainer = ch->in_room->people;
    if (trainer != (CHAR_DATA *)0x0) {
      do {
        if ((trainer->act[0] & 1) != 0) {
          lVar2 = 0;
          do {
            if (-1 < trainer->pIndexData->profs_taught[lVar2]) goto LAB_00372064;
            lVar2 = lVar2 + 1;
          } while (lVar2 != 4);
        }
        trainer = trainer->next_in_room;
      } while (trainer != (CHAR_DATA *)0x0);
      trainer = (char_data *)0x0;
LAB_00372064:
      if (trainer != (char_data *)0x0) {
        pCVar3 = (CProficiencies *)argument;
        bVar1 = str_cmp(argument,"basic");
        if (bVar1) {
          if (*argument != '\0') {
            CProficiencies::TrainProficiency(pCVar3,ch,trainer,argument);
            return;
          }
          CProficiencies::GetProfsTaughtByTrainer(pCVar3,ch,trainer);
          return;
        }
        goto LAB_003720da;
      }
    }
    bVar1 = str_cmp(argument,"basic");
    if (bVar1) {
      if (ch->pcdata == (PC_DATA *)0x0) {
        pCVar3 = &prof_none;
      }
      else {
        pCVar3 = &ch->pcdata->profs;
      }
      CProficiencies::ListKnownProficiencies(pCVar3,ch);
      return;
    }
    bVar1 = str_cmp(argument,"basic");
    if (!bVar1) {
LAB_003720da:
      if (ch->pcdata == (PC_DATA *)0x0) {
        pCVar3 = &prof_none;
      }
      else {
        pCVar3 = &ch->pcdata->profs;
      }
      CProficiencies::ListBasicProficiencies(pCVar3,ch);
      return;
    }
  }
  return;
}

Assistant:

void do_proficiencies(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *trainer = nullptr;
	bool bBreak= false;

	if (IS_NPC(ch))
		return;

	for (auto iterator = ch->in_room->people; iterator && !bBreak; iterator = iterator->next_in_room)
	{
		if (!IS_NPC(iterator))
			continue;

		for (int i = 0; i < MAX_PROFS_TAUGHT_BY_MOB && !bBreak; i++)
		{
			if (iterator->pIndexData->profs_taught[i] > -1)
			{
				bBreak = true;
				trainer = iterator;
				break;
			}
		}
	}

	if (!trainer && str_cmp(argument, "basic"))
	{
		ch->Profs()->ListKnownProficiencies(ch);
		return;
	}
	else if (!str_cmp(argument, "basic"))
	{
		ch->Profs()->ListBasicProficiencies(ch);
		return;
	}

	if (!trainer)
		return;

	if (argument[0] != '\0')
	{
		ch->Profs()->TrainProficiency(ch, trainer, argument);
		return;
	}

	ch->Profs()->GetProfsTaughtByTrainer(ch, trainer);
}